

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

int moveresults(lua_State *L,TValue *firstResult,StkId res,int nres,int wanted)

{
  undefined4 uVar1;
  StkId pTVar2;
  TValue *pTVar3;
  TValue *io1_3;
  TValue *io1_2;
  int i_1;
  TValue *io1_1;
  int i;
  TValue *io1;
  int wanted_local;
  int nres_local;
  StkId res_local;
  TValue *firstResult_local;
  lua_State *L_local;
  
  if (wanted == -1) {
    for (io1_1._4_4_ = 0; io1_1._4_4_ < nres; io1_1._4_4_ = io1_1._4_4_ + 1) {
      pTVar2 = res + io1_1._4_4_;
      pTVar3 = firstResult + io1_1._4_4_;
      pTVar2->value_ = pTVar3->value_;
      uVar1 = *(undefined4 *)&pTVar3->field_0xc;
      pTVar2->tt_ = pTVar3->tt_;
      *(undefined4 *)&pTVar2->field_0xc = uVar1;
    }
    L->top = res + nres;
    L_local._4_4_ = 0;
  }
  else {
    if (wanted != 0) {
      if (wanted == 1) {
        res_local = firstResult;
        if (nres == 0) {
          res_local = &luaO_nilobject_;
        }
        res->value_ = res_local->value_;
        uVar1 = *(undefined4 *)&res_local->field_0xc;
        res->tt_ = res_local->tt_;
        *(undefined4 *)&res->field_0xc = uVar1;
      }
      else if (nres < wanted) {
        for (io1_2._4_4_ = 0; io1_2._4_4_ < nres; io1_2._4_4_ = io1_2._4_4_ + 1) {
          pTVar2 = res + io1_2._4_4_;
          pTVar3 = firstResult + io1_2._4_4_;
          pTVar2->value_ = pTVar3->value_;
          uVar1 = *(undefined4 *)&pTVar3->field_0xc;
          pTVar2->tt_ = pTVar3->tt_;
          *(undefined4 *)&pTVar2->field_0xc = uVar1;
        }
        for (; io1_2._4_4_ < wanted; io1_2._4_4_ = io1_2._4_4_ + 1) {
          res[io1_2._4_4_].tt_ = 0;
        }
      }
      else {
        for (io1_2._4_4_ = 0; io1_2._4_4_ < wanted; io1_2._4_4_ = io1_2._4_4_ + 1) {
          pTVar2 = res + io1_2._4_4_;
          pTVar3 = firstResult + io1_2._4_4_;
          pTVar2->value_ = pTVar3->value_;
          uVar1 = *(undefined4 *)&pTVar3->field_0xc;
          pTVar2->tt_ = pTVar3->tt_;
          *(undefined4 *)&pTVar2->field_0xc = uVar1;
        }
      }
    }
    L->top = res + wanted;
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int moveresults (lua_State *L, const TValue *firstResult, StkId res,
                                      int nres, int wanted) {
  switch (wanted) {  /* handle typical cases separately */
    case 0: break;  /* nothing to move */
    case 1: {  /* one result needed */
      if (nres == 0)   /* no results? */
        firstResult = luaO_nilobject;  /* adjust with nil */
      setobjs2s(L, res, firstResult);  /* move it to proper place */
      break;
    }
    case LUA_MULTRET: {
      int i;
      for (i = 0; i < nres; i++)  /* move all results to correct place */
        setobjs2s(L, res + i, firstResult + i);
      L->top = res + nres;
      return 0;  /* wanted == LUA_MULTRET */
    }
    default: {
      int i;
      if (wanted <= nres) {  /* enough results? */
        for (i = 0; i < wanted; i++)  /* move wanted results to correct place */
          setobjs2s(L, res + i, firstResult + i);
      }
      else {  /* not enough results; use all of them plus nils */
        for (i = 0; i < nres; i++)  /* move all results to correct place */
          setobjs2s(L, res + i, firstResult + i);
        for (; i < wanted; i++)  /* complete wanted number of results */
          setnilvalue(res + i);
      }
      break;
    }
  }
  L->top = res + wanted;  /* top points after the last result */
  return 1;
}